

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

int __thiscall lsim::Simulator::init(Simulator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  pointer pVVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pNVar6;
  pointer puVar7;
  iterator iVar8;
  pointer ppSVar9;
  long lVar10;
  iterator __position;
  pointer puVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  int extraout_EAX;
  ulong uVar15;
  pointer pVVar16;
  _Any_data *p_Var17;
  _Any_data *this_00;
  _Any_data *p_Var18;
  _Any_data *p_Var19;
  pointer ppSVar20;
  pointer ppSVar21;
  _Base_ptr p_Var22;
  uint *puVar23;
  NodeMetadata *meta;
  pointer pNVar24;
  pointer puVar25;
  uint uStack_ac;
  _Any_data *p_Stack_a8;
  pointer ppSStack_a0;
  pointer ppSStack_98;
  undefined1 *puStack_90;
  SimComponent **ppSStack_88;
  _Any_data *p_Stack_80;
  SimComponent *pSStack_78;
  uint *puStack_70;
  Simulator *pSStack_68;
  pointer ppSStack_60;
  pointer ppSStack_58;
  undefined1 *puStack_50;
  SimComponent **ppSStack_48;
  Simulator *local_38;
  SimComponent *local_30;
  
  this->m_time = 1;
  pVVar16 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar16 != pVVar3) {
    memset(pVVar16,0,((long)pVVar3 + (-4 - (long)pVVar16) & 0xfffffffffffffffcU) + 4);
  }
  pVVar16 = (this->m_node_values_write).
            super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar3 = (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar16 != pVVar3) {
    memset(pVVar16,0,((long)pVVar3 + (-4 - (long)pVVar16) & 0xfffffffffffffffcU) + 4);
  }
  puVar4 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    memset(puVar4,0,((long)puVar5 + (-8 - (long)puVar4) & 0xfffffffffffffff8U) + 8);
  }
  puVar4 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    memset(puVar4,0,((long)puVar5 + (-8 - (long)puVar4) & 0xfffffffffffffff8U) + 8);
  }
  puVar4 = (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    memset(puVar4,0,((long)puVar5 + (-8 - (long)puVar4) & 0xfffffffffffffff8U) + 8);
  }
  pNVar6 = (this->m_node_metadata).
           super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar24 = (this->m_node_metadata).
                 super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl
                 .super__Vector_impl_data._M_start; pNVar24 != pNVar6; pNVar24 = pNVar24 + 1) {
    pNVar24->m_default = VALUE_UNDEFINED;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(pNVar24->m_active_pins)._M_t);
    pNVar24->m_time_dirty_write = 0;
  }
  puVar7 = (this->m_components).
           super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar25 = (this->m_components).
                 super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar7; puVar25 = puVar25 + 1
      ) {
    SimComponent::apply_initial_values
              ((puVar25->_M_t).
               super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>.
               _M_t.
               super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
               .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl);
  }
  ppSVar20 = (this->m_init_components).
             super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppSVar21 = (this->m_init_components).
             super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (ppSVar20 != ppSVar21) {
    do {
      local_30 = *ppSVar20;
      uVar15 = (ulong)local_30->m_comp_desc->m_type;
      this_00 = (_Any_data *)
                (this->m_sim_functions).
                super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_38 = this;
      if (*(long *)(this_00 + uVar15 * 6 + 1) == 0) {
        std::__throw_bad_function_call();
        *(long *)this_00 = *(long *)this_00 + 1;
        ppSVar9 = *(pointer *)
                   &(((component_refs_t *)(this_00->_M_pod_data + 0x68))->
                    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>)
                    ._M_impl;
        if (*(pointer *)(this_00->_M_pod_data + 0x70) != ppSVar9) {
          *(pointer *)(this_00->_M_pod_data + 0x70) = ppSVar9;
        }
        puVar23 = *(uint **)&(((node_container_t *)(this_00->_M_pod_data + 0x110))->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl;
        puStack_70 = *(uint **)(this_00->_M_pod_data + 0x118);
        p_Var19 = this_00;
        pSStack_68 = this;
        ppSStack_60 = ppSVar20;
        ppSStack_58 = ppSVar21;
        puStack_50 = (undefined1 *)&local_38;
        ppSStack_48 = &local_30;
        if (puVar23 != puStack_70) {
          puStack_50 = (undefined1 *)&local_38;
          do {
            uVar1 = *puVar23;
            lVar10 = *(long *)&(((node_metadata_container_t *)(this_00->_M_pod_data + 0xb0))->
                               super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>
                               )._M_impl;
            p_Var17 = *(_Any_data **)(lVar10 + (ulong)uVar1 * 0x88 + 0x20);
            while (p_Var18 = p_Var17, p_Var18 != (_Any_data *)(lVar10 + (ulong)uVar1 * 0x88 + 0x10))
            {
              p_Stack_80 = *(_Any_data **)
                            &((_Rb_tree_node_base *)(p_Var18->_M_pod_data + 0x20))->_M_color;
              if (*(long *)(*(long *)&(((timestamp_container_t *)(this_00->_M_pod_data + 0x20))->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl +
                           (ulong)*(uint *)(p_Stack_80->_M_pod_data + 0x10) * 8) != *(long *)this_00
                 ) {
                __position._M_current = *(SimComponent ***)(this_00->_M_pod_data + 0x70);
                if (__position._M_current == *(SimComponent ***)(this_00->_M_pod_data + 0x78)) {
                  ppSStack_88 = (SimComponent **)0x115d4e;
                  std::vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>>::
                  _M_realloc_insert<lsim::SimComponent*const&>
                            ((vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>> *)
                             (this_00->_M_pod_data + 0x68),__position,(SimComponent **)&p_Stack_80);
                }
                else {
                  *__position._M_current = (SimComponent *)p_Stack_80;
                  *(pointer *)(this_00->_M_pod_data + 0x70) =
                       *(pointer *)(this_00->_M_pod_data + 0x70) + 1;
                }
                *(undefined8 *)
                 (*(long *)&(((timestamp_container_t *)(this_00->_M_pod_data + 0x20))->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl + (ulong)*(uint *)(p_Stack_80->_M_pod_data + 0x10) * 8) =
                     *(undefined8 *)this_00;
              }
              ppSStack_88 = (SimComponent **)0x115d68;
              p_Var17 = (_Any_data *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
              p_Var19 = p_Var18;
            }
            puVar23 = puVar23 + 1;
          } while (puVar23 != puStack_70);
        }
        ppSVar21 = *(pointer *)
                    &(((component_refs_t *)(this_00->_M_pod_data + 0x68))->
                     super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>
                     )._M_impl;
        ppSVar20 = *(pointer *)(this_00->_M_pod_data + 0x70);
        if (ppSVar21 == ppSVar20) {
LAB_00115ddd:
          ppSVar21 = *(pointer *)
                      &(((component_refs_t *)(this_00->_M_pod_data + 0x50))->
                       super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>
                       )._M_impl;
          ppSVar20 = *(pointer *)(this_00->_M_pod_data + 0x58);
          if (ppSVar21 == ppSVar20) {
LAB_00115e37:
            puVar11 = *(pointer *)
                       &(((node_container_t *)(this_00->_M_pod_data + 0x110))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
            if (*(pointer *)(this_00->_M_pod_data + 0x118) != puVar11) {
              *(pointer *)(this_00->_M_pod_data + 0x118) = puVar11;
            }
            ppSStack_88 = (SimComponent **)0x115e56;
            postprocess_dirty_nodes((Simulator *)this_00);
            return extraout_EAX;
          }
          while( true ) {
            pSStack_78 = *ppSVar21;
            uVar15 = (ulong)pSStack_78->m_comp_desc->m_type;
            lVar10 = *(long *)&(((sim_func_container_t *)(this_00->_M_pod_data + 0x170))->
                               super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                               )._M_impl;
            if (*(long *)(lVar10 + uVar15 * 0x60 + 0x50) == 0) break;
            p_Var19 = (_Any_data *)(lVar10 + uVar15 * 0x60 + 0x40);
            ppSStack_88 = (SimComponent **)0x115e2e;
            p_Stack_80 = this_00;
            (**(code **)(lVar10 + uVar15 * 0x60 + 0x58))
                      (p_Var19,(Simulator **)&p_Stack_80,&pSStack_78);
            ppSVar21 = ppSVar21 + 1;
            if (ppSVar21 == ppSVar20) goto LAB_00115e37;
          }
        }
        else {
          while( true ) {
            pSStack_78 = *ppSVar21;
            uVar15 = (ulong)pSStack_78->m_comp_desc->m_type;
            lVar10 = *(long *)&(((sim_func_container_t *)(this_00->_M_pod_data + 0x170))->
                               super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
                               )._M_impl;
            if (*(long *)(lVar10 + uVar15 * 0x60 + 0x30) == 0) break;
            p_Var19 = (_Any_data *)(lVar10 + uVar15 * 0x60 + 0x20);
            ppSStack_88 = (SimComponent **)0x115dd4;
            p_Stack_80 = this_00;
            (**(code **)(lVar10 + uVar15 * 0x60 + 0x38))
                      (p_Var19,(Simulator **)&p_Stack_80,&pSStack_78);
            ppSVar21 = ppSVar21 + 1;
            if (ppSVar21 == ppSVar20) goto LAB_00115ddd;
          }
        }
        ppSStack_88 = (SimComponent **)postprocess_dirty_nodes;
        p_Stack_80 = this_00;
        std::__throw_bad_function_call();
        p_Var22 = *(_Base_ptr *)
                   &(((node_container_t *)(p_Var19->_M_pod_data + 0x128))->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
        p_Var12 = *(_Base_ptr *)(p_Var19->_M_pod_data + 0x130);
        if (p_Var22 == p_Var12) goto LAB_00115f70;
        p_Stack_a8 = this_00;
        ppSStack_a0 = ppSVar21;
        ppSStack_98 = ppSVar20;
        puStack_90 = (undefined1 *)&p_Stack_80;
        ppSStack_88 = &pSStack_78;
        do {
          uStack_ac = p_Var22->_M_color;
          uVar15 = (ulong)uStack_ac;
          p_Var13 = *(_Base_ptr *)
                     &(((node_metadata_container_t *)(p_Var19->_M_pod_data + 0xb0))->
                      super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>).
                      _M_impl;
          lVar10 = (long)p_Var13 + uVar15 * 0x88;
          lVar14 = *(long *)((long)p_Var13 + uVar15 * 0x88 + 0x78);
          if (lVar14 == 1) {
            *(undefined4 *)
             ((long)&(*(_Base_ptr *)
                       &(((value_container_t *)(p_Var19->_M_pod_data + 0xf8))->
                        super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl)->
                     _M_color + uVar15 * 4) =
                 *(undefined4 *)
                  ((long)&(*(_Base_ptr *)
                            &(((value_container_t *)(p_Var19->_M_pod_data + 0x98))->
                             super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl)
                          ->_M_color + (ulong)*(uint *)(*(long *)(lVar10 + 0x68) + 0x20) * 4);
LAB_00115ef4:
            *(undefined8 *)
             (*(long *)&((_Rb_tree_node_base *)(p_Var19->_M_pod_data + 0x140))->_M_color +
             uVar15 * 8) = *(undefined8 *)p_Var19;
          }
          else {
            if (lVar14 == 0) {
              *(undefined4 *)
               ((long)&(*(_Base_ptr *)
                         &(((value_container_t *)(p_Var19->_M_pod_data + 0xf8))->
                          super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl)->
                       _M_color + uVar15 * 4) = *(undefined4 *)lVar10;
              goto LAB_00115ef4;
            }
            *(undefined4 *)
             ((long)&(*(_Base_ptr *)
                       &(((value_container_t *)(p_Var19->_M_pod_data + 0xf8))->
                        super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl)->
                     _M_color + uVar15 * 4) = 3;
          }
          lVar10 = *(long *)&((_Rb_tree_node_base *)(p_Var19->_M_pod_data + 0xe0))->_M_color;
          iVar2 = *(int *)((long)&(*(_Base_ptr *)
                                    &(((value_container_t *)(p_Var19->_M_pod_data + 0xf8))->
                                     super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>).
                                     _M_impl)->_M_color + uVar15 * 4);
          if (*(int *)(lVar10 + uVar15 * 4) != iVar2) {
            *(undefined8 *)
             ((long)&(*(_Base_ptr *)
                       &(((timestamp_container_t *)(p_Var19->_M_pod_data + 0x158))->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl)
                     ->_M_color + uVar15 * 8) = *(undefined8 *)p_Var19;
            *(int *)(lVar10 + uVar15 * 4) = iVar2;
            iVar8._M_current = *(uint **)(p_Var19->_M_pod_data + 0x118);
            if (iVar8._M_current ==
                *(uint **)&((_Rb_tree_node_base *)(p_Var19->_M_pod_data + 0x120))->_M_color) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         (p_Var19->_M_pod_data + 0x110),iVar8,&uStack_ac);
            }
            else {
              *iVar8._M_current = uStack_ac;
              *(_Base_ptr *)(p_Var19->_M_pod_data + 0x118) = (_Base_ptr)(iVar8._M_current + 1);
            }
          }
          p_Var22 = (_Base_ptr)&p_Var22->field_0x4;
          if (p_Var22 == p_Var12) {
LAB_00115f70:
            p_Var22 = *(_Base_ptr *)
                       &(((node_container_t *)(p_Var19->_M_pod_data + 0x128))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
            if (*(_Base_ptr *)(p_Var19->_M_pod_data + 0x130) != p_Var22) {
              *(_Base_ptr *)(p_Var19->_M_pod_data + 0x130) = p_Var22;
            }
            return (int)p_Var22;
          }
        } while( true );
      }
      (**(code **)((long)(this_00 + uVar15 * 6) + 0x18))(this_00 + uVar15 * 6,&local_38,&local_30);
      ppSVar20 = ppSVar20 + 1;
    } while (ppSVar20 != ppSVar21);
  }
  local_38 = (Simulator *)((ulong)local_38 & 0xffffffff00000000);
  pVVar16 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar16 !=
      (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pVVar16 = (pointer)0x0;
    do {
      iVar8._M_current =
           (this->m_dirty_nodes_read).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_dirty_nodes_read,
                   iVar8,(uint *)&local_38);
      }
      else {
        *iVar8._M_current = (uint)pVVar16;
        (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      pVVar16 = (pointer)(ulong)((int)local_38 + 1U);
      local_38 = (Simulator *)CONCAT44(local_38._4_4_,(int)local_38 + 1U);
    } while (pVVar16 < (pointer)((long)(this->m_node_values_read).
                                       super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_node_values_read).
                                       super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return (int)pVVar16;
}

Assistant:

void Simulator::init() {
    m_time = 1;

    std::fill(std::begin(m_node_values_read), std::end(m_node_values_read), VALUE_FALSE);
    std::fill(std::begin(m_node_values_write), std::end(m_node_values_write), VALUE_FALSE);
    std::fill(std::begin(m_node_write_time), std::end(m_node_write_time), 0);
    std::fill(std::begin(m_node_change_time), std::end(m_node_change_time), 0);
	std::fill(std::begin(m_input_changed), std::end(m_input_changed), 0);

    for (auto &meta : m_node_metadata) {
        meta.m_default = VALUE_UNDEFINED;
		meta.m_active_pins.clear();
		meta.m_time_dirty_write = 0;
    }

    // apply initial values
    for (auto &comp : m_components) {
		comp->apply_initial_values();
    }

    // run one time setup functions
    for (auto comp : m_init_components) {
        auto &setup_func = m_sim_functions[comp->description()->type()][SIM_FUNCTION_SETUP];
        setup_func(this, comp);
    }

    // mark all nodes as dirty for the first run
    for (node_t node = 0; node < m_node_values_read.size(); ++node) {
        m_dirty_nodes_read.push_back(node);
    }
}